

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPipeConnection.cxx
# Opt level: O0

bool __thiscall cmPipeConnection::OnServeStart(cmPipeConnection *this,string *errorMessage)

{
  uv_loop_t *ctx;
  uv_pipe_s *handle;
  char *pcVar1;
  uv_stream_t *stream;
  allocator local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  allocator local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_24;
  string *psStack_20;
  int r;
  string *errorMessage_local;
  cmPipeConnection *this_local;
  
  psStack_20 = errorMessage;
  errorMessage_local = (string *)this;
  ctx = cmServerBase::GetLoop((this->super_cmEventBasedConnection).super_cmConnection.Server);
  auto_pipe_t::init(&this->ServerPipe,(EVP_PKEY_CTX *)ctx);
  handle = auto_handle_::operator_cast_to_uv_pipe_s_((auto_handle_ *)&this->ServerPipe);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  local_24 = uv_pipe_bind(handle,pcVar1);
  if (local_24 == 0) {
    stream = auto_pipe_t::operator_cast_to_uv_stream_s_(&this->ServerPipe);
    local_24 = uv_listen(stream,1,cmEventBasedConnection::on_new_connection);
    if (local_24 == 0) {
      this_local._7_1_ = cmConnection::OnServeStart((cmConnection *)this,psStack_20);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_140,"Internal Error listening on ",&local_141);
      std::operator+(&local_120,&local_140,&this->PipeName);
      std::operator+(&local_100,&local_120,": ");
      pcVar1 = uv_err_name(local_24);
      std::operator+(&local_e0,&local_100,pcVar1);
      std::__cxx11::string::operator=((string *)psStack_20,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator((allocator<char> *)&local_141);
      this_local._7_1_ = false;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a8,"Internal Error with ",&local_a9);
    std::operator+(&local_88,&local_a8,&this->PipeName);
    std::operator+(&local_68,&local_88,": ");
    pcVar1 = uv_err_name(local_24);
    std::operator+(&local_48,&local_68,pcVar1);
    std::__cxx11::string::operator=((string *)psStack_20,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmPipeConnection::OnServeStart(std::string* errorMessage)
{
  this->ServerPipe.init(*this->Server->GetLoop(), 0,
                        static_cast<cmEventBasedConnection*>(this));

  int r;
  if ((r = uv_pipe_bind(this->ServerPipe, this->PipeName.c_str())) != 0) {
    *errorMessage = std::string("Internal Error with ") + this->PipeName +
      ": " + uv_err_name(r);
    return false;
  }

  if ((r = uv_listen(this->ServerPipe, 1, on_new_connection)) != 0) {
    *errorMessage = std::string("Internal Error listening on ") +
      this->PipeName + ": " + uv_err_name(r);
    return false;
  }

  return cmConnection::OnServeStart(errorMessage);
}